

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGen::ParentDir_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  cmQtAutoGen *pcVar1;
  cmQtAutoGen *pcVar2;
  cmQtAutoGen *pcVar3;
  size_t sVar4;
  
  sVar4 = filename._M_len;
  pcVar3 = this;
  if (this == (cmQtAutoGen *)0x0) {
LAB_0060f759:
    pcVar2 = (cmQtAutoGen *)0xffffffffffffffff;
  }
  else {
    do {
      pcVar2 = pcVar3 + -1;
      if (pcVar3 == (cmQtAutoGen *)0x0) goto LAB_0060f759;
      pcVar1 = pcVar3 + (sVar4 - 1);
      pcVar3 = pcVar2;
    } while (*pcVar1 != (cmQtAutoGen)0x2f);
  }
  if (pcVar2 == (cmQtAutoGen *)0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (this < pcVar2) {
      pcVar2 = this;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar4,pcVar2 + sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::ParentDir(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos == cm::string_view::npos) {
    return std::string();
  }
  return std::string(filename.substr(0, slashPos));
}